

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool tinygltf::detail::
     ForEachInArray<tinygltf::TinyGLTF::LoadFromString(tinygltf::Model*,std::__cxx11::string*,std::__cxx11::string*,char_const*,unsigned_int,std::__cxx11::string_const&,unsigned_int)::__6>
               (json *_v,char *member,anon_class_32_4_9f7a1e9d *cb)

{
  char cVar1;
  mapped_type_conflict mVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  reference pbVar8;
  string *o;
  key_type *pkVar9;
  mapped_type_conflict *pmVar10;
  long *plVar11;
  undefined8 *puVar12;
  value_t vVar13;
  string *psVar14;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *extraout_RDX_02;
  json *pjVar15;
  json *extraout_RDX_03;
  json *extraout_RDX_04;
  json *extraout_RDX_05;
  byte bVar16;
  _Alloc_hider _Var17;
  undefined1 required;
  undefined8 uVar18;
  string *parent_node;
  Primitive *this;
  json_const_iterator dictIt;
  json_const_iterator it_1;
  json_const_array_iterator i_1;
  json_const_iterator targetsObject;
  int indices;
  int mode;
  int material;
  json_const_iterator dictItEnd_1;
  json_const_iterator dictIt_1;
  json_const_iterator primObject;
  Primitive primitive;
  json_const_iterator itm;
  json_const_array_iterator it;
  json_const_array_iterator i;
  json_const_array_iterator primEnd;
  json_const_array_iterator end;
  undefined1 local_500 [39];
  value_t local_4d9;
  undefined1 local_4d8 [8];
  iterator iStack_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  _Base_ptr local_4b8;
  size_t local_4b0;
  string *local_4a0;
  string *local_498;
  undefined1 local_490 [39];
  allocator local_469;
  undefined1 local_468 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  int local_438;
  int local_434;
  key_type local_430;
  char *local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  Value *local_3c8;
  size_t *local_3c0;
  json_const_iterator local_3b8;
  undefined1 local_398 [8];
  iterator iStack_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Base_ptr local_378;
  size_t local_370;
  undefined8 local_368;
  int local_360;
  pointer local_358;
  pointer pmStack_350;
  pointer local_348;
  ExtensionMap local_340;
  Value local_310;
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_230 [280];
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  json_const_iterator local_d8;
  const_iterator local_b0;
  const_iterator local_90;
  const_iterator local_70;
  const_iterator local_50;
  
  local_d8.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_d8.m_object = (pointer)0x0;
  local_d8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_d8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_410 = member;
  bVar6 = FindMember(_v,"meshes",&local_d8);
  if ((bVar6) &&
     (pbVar8 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_d8), pbVar8->m_type == array)) {
    pbVar8 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin(&local_b0,pbVar8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend(&local_50,pbVar8);
    bVar6 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_b0,&local_50);
    if (!bVar6) {
      local_3c0 = &local_340._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_3c8 = (Value *)(local_230 + 0x80);
      do {
        psVar14 = (string *)local_398;
        o = (string *)
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator*(&local_b0);
        vVar13 = *(value_t *)&(o->_M_dataplus)._M_p;
        if (vVar13 == object) {
          local_230._0_8_ = local_230 + 0x10;
          local_230._8_8_ = 0;
          local_230[0x10] = '\0';
          local_230._88_4_ = _S_red;
          local_230._96_8_ = (_Base_ptr)0x0;
          local_230._64_8_ = (pointer)0x0;
          local_230._72_8_ = (pointer)0x0;
          local_230._48_8_ = (pointer)0x0;
          local_230._56_8_ = (pointer)0x0;
          local_230._32_8_ = (Primitive *)0x0;
          local_230._40_8_ = (Primitive *)0x0;
          local_230._104_8_ = local_230 + 0x58;
          local_230._136_8_ = 0.0;
          local_230._120_8_ = 0;
          local_230._128_4_ = 0;
          local_230._132_4_ = 0;
          local_230._144_8_ = local_230 + 0xa0;
          local_230._152_8_ = 0;
          local_230[0xa0] = '\0';
          local_230._232_4_ = _S_red;
          local_230._240_8_ = (_Base_ptr)0x0;
          local_230._208_8_ = (pointer)0x0;
          local_230._216_8_ = (pointer)0x0;
          local_230._192_8_ = (pointer)0x0;
          local_230._200_8_ = (pointer)0x0;
          local_230._176_8_ = (pointer)0x0;
          local_230._184_8_ = (pointer)0x0;
          local_230._248_8_ = local_230 + 0xe8;
          local_230._264_8_ = 0;
          local_230[0x110] = false;
          local_118._M_p = (pointer)&local_108;
          local_110 = 0;
          local_108._M_local_buf[0] = '\0';
          local_f8._M_p = (pointer)&local_e8;
          local_f0 = 0;
          local_e8._M_local_buf[0] = '\0';
          local_4a0 = (string *)**(undefined8 **)local_410;
          cVar1 = *(char *)(*(long *)(local_410 + 0x18) + 0x19);
          local_398 = (undefined1  [8])&local_388;
          iStack_390._M_node = (_Base_ptr)0x4;
          local_388._M_allocated_capacity._0_5_ = 0x656d616e;
          iStack_4d0._M_node = (_Base_ptr)0x0;
          local_4c8._M_allocated_capacity = local_4c8._M_allocated_capacity & 0xffffffffffffff00;
          uVar18 = 0;
          parent_node = (string *)local_4d8;
          local_4d9 = vVar13;
          local_4d8 = (undefined1  [8])&local_4c8;
          local_448._M_allocated_capacity = (size_type)o;
          local_230._112_8_ = local_230._104_8_;
          local_230._256_8_ = local_230._248_8_;
          ParseStringProperty((string *)local_230,local_4a0,(json *)o,psVar14,false,parent_node);
          if (local_4d8 != (undefined1  [8])&local_4c8) {
            operator_delete((void *)local_4d8);
          }
          if (local_398 != (undefined1  [8])&local_388) {
            operator_delete((void *)local_398);
          }
          uVar5 = local_230._40_8_;
          uVar4 = local_230._32_8_;
          this = (Primitive *)local_230._32_8_;
          if (local_230._40_8_ != local_230._32_8_) {
            do {
              Primitive::~Primitive(this);
              this = this + 1;
            } while (this != (Primitive *)uVar5);
            local_230._40_8_ = uVar4;
          }
          local_3b8.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_3b8.m_object = (pointer)0x0;
          local_3b8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_3b8.m_it.primitive_iterator.m_it = -0x8000000000000000;
          bVar6 = FindMember((json *)local_448._M_allocated_capacity,"primitives",&local_3b8);
          required = (undefined1)uVar18;
          if (bVar6) {
            pbVar8 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_3b8);
            required = (undefined1)uVar18;
            if (pbVar8->m_type == array) {
              pbVar8 = nlohmann::detail::
                       iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&local_3b8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::cend(&local_70,pbVar8);
              pbVar8 = nlohmann::detail::
                       iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&local_3b8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::cbegin(&local_90,pbVar8);
              bVar6 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::
                      operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                (&local_90,&local_70);
              while( true ) {
                required = (undefined1)uVar18;
                if (bVar6 != false) break;
                iStack_390._M_node = iStack_390._M_node & 0xffffffff00000000;
                local_388._M_allocated_capacity = 0;
                local_388._8_8_ = &iStack_390;
                local_370 = 0;
                local_368._0_4_ = -1;
                local_368._4_4_ = -1;
                local_360 = -1;
                local_348 = (pointer)0x0;
                local_358 = (pointer)0x0;
                pmStack_350 = (pointer)0x0;
                local_340._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_340._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_340._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_340._M_t._M_impl.super__Rb_tree_header._M_header;
                local_3c0[2] = 0;
                *local_3c0 = 0;
                local_3c0[1] = 0;
                local_310.string_value_._M_dataplus._M_p = (pointer)&local_310.string_value_.field_2
                ;
                local_310.string_value_._M_string_length = 0;
                local_310.string_value_.field_2._M_local_buf[0] = '\0';
                local_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     _S_red;
                local_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x0;
                local_310.array_value_.
                super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_310.array_value_.
                super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_310.binary_value_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_310.array_value_.
                super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_310.binary_value_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_310.binary_value_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header;
                local_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_310.boolean_value_ = false;
                local_278._M_p = (pointer)&local_268;
                local_270 = 0;
                local_268._M_local_buf[0] = '\0';
                local_258._M_p = (pointer)&local_248;
                local_250 = 0;
                local_248._M_local_buf[0] = '\0';
                local_378 = (_Base_ptr)local_388._8_8_;
                local_340._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_340._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                local_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                local_498 = (string *)
                            nlohmann::detail::
                            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::operator*(&local_90);
                local_434 = -1;
                local_4c8._M_allocated_capacity = 0x6c6169726574616d;
                iStack_4d0._M_node = (_Base_ptr)0x8;
                local_4c8._8_8_ = local_4c8._8_8_ & 0xffffffffffffff00;
                local_500._8_8_ = (_Base_ptr)0x0;
                local_500._16_8_ = local_500._16_8_ & 0xffffffffffffff00;
                local_500._0_8_ = local_500 + 0x10;
                local_4d8 = (undefined1  [8])&local_4c8;
                ParseIntegerProperty
                          (&local_434,local_4a0,(json *)local_498,(string *)local_4d8,false,
                           (string *)local_500);
                if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
                  operator_delete((void *)local_500._0_8_);
                }
                if (local_4d8 != (undefined1  [8])&local_4c8) {
                  operator_delete((void *)local_4d8);
                }
                local_368._0_4_ = local_434;
                local_438 = 4;
                iStack_4d0._M_node = (_Base_ptr)0x4;
                local_4c8._M_allocated_capacity._0_5_ = 0x65646f6d;
                local_500._8_8_ = (_Base_ptr)0x0;
                local_500._16_8_ = local_500._16_8_ & 0xffffffffffffff00;
                local_500._0_8_ = local_500 + 0x10;
                local_4d8 = (undefined1  [8])&local_4c8;
                ParseIntegerProperty
                          (&local_438,local_4a0,(json *)local_498,(string *)local_4d8,false,
                           (string *)local_500);
                if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
                  operator_delete((void *)local_500._0_8_);
                }
                if (local_4d8 != (undefined1  [8])&local_4c8) {
                  operator_delete((void *)local_4d8);
                }
                local_360 = local_438;
                local_448._12_4_ = -1;
                local_4c8._M_allocated_capacity = 0x73656369646e69;
                iStack_4d0._M_node = (_Base_ptr)0x7;
                local_500._8_8_ = (_Base_ptr)0x0;
                local_500._16_8_ = local_500._16_8_ & 0xffffffffffffff00;
                uVar18 = 0;
                parent_node = (string *)local_500;
                local_500._0_8_ = (string *)(local_500 + 0x10);
                local_4d8 = (undefined1  [8])&local_4c8;
                ParseIntegerProperty
                          ((int *)(local_448._M_local_buf + 0xc),local_4a0,(json *)local_498,
                           (string *)local_4d8,false,parent_node);
                if ((string *)local_500._0_8_ != (string *)(local_500 + 0x10)) {
                  operator_delete((void *)local_500._0_8_);
                }
                if (local_4d8 != (undefined1  [8])&local_4c8) {
                  operator_delete((void *)local_4d8);
                }
                local_368._4_4_ = local_448._12_4_;
                local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                local_408.field_2._M_allocated_capacity = 0x7475626972747461;
                local_408.field_2._8_2_ = 0x7365;
                local_408._M_string_length = 10;
                psVar14 = (string *)0x0;
                local_408.field_2._M_local_buf[10] = '\0';
                local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
                local_430.field_2._M_allocated_capacity = 0x766974696d697250;
                local_430.field_2._M_local_buf[8] = 'e';
                local_430._M_string_length = 9;
                local_430.field_2._M_local_buf[9] = '\0';
                local_4c8._M_allocated_capacity = 0;
                local_4d8 = (undefined1  [8])0x0;
                iStack_4d0._M_node = (_Base_ptr)0x0;
                local_4c8._8_8_ = (iterator *)0x8000000000000000;
                bVar6 = FindMember((json *)local_498,local_408._M_dataplus._M_p,
                                   (json_const_iterator *)local_4d8);
                if (bVar6) {
                  pbVar8 = nlohmann::detail::
                           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)local_4d8);
                  if (pbVar8->m_type != object) {
                    if (local_4a0 != (string *)0x0) {
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_468,"\'",&local_408);
                      puVar12 = (undefined8 *)std::__cxx11::string::append(local_468);
                      local_500._0_8_ = local_500 + 0x10;
                      psVar14 = (string *)(puVar12 + 2);
                      if ((string *)*puVar12 == psVar14) {
                        local_500._16_8_ = (psVar14->_M_dataplus)._M_p;
                        local_500._24_8_ = puVar12[3];
                      }
                      else {
                        local_500._16_8_ = (psVar14->_M_dataplus)._M_p;
                        local_500._0_8_ = (string *)*puVar12;
                      }
                      local_500._8_8_ = puVar12[1];
                      *puVar12 = psVar14;
                      puVar12[1] = 0;
                      *(undefined1 *)(puVar12 + 2) = 0;
                      std::__cxx11::string::_M_append((char *)local_4a0,local_500._0_8_);
LAB_001146e0:
                      if ((string *)local_500._0_8_ != (string *)(local_500 + 0x10)) {
                        operator_delete((void *)local_500._0_8_);
                      }
                      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_468;
                      _Var17._M_p = (pointer)local_468._0_8_;
                      goto LAB_00114704;
                    }
                    goto LAB_0011470e;
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_398);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::cbegin((const_iterator *)local_500,pbVar8);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::cend((const_iterator *)local_468,pbVar8);
                  bVar6 = nlohmann::detail::
                          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::
                          operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                    ((const_iterator *)local_500,(const_iterator *)local_468);
                  while (!bVar6) {
                    pbVar8 = nlohmann::detail::
                             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)local_500);
                    bVar16 = pbVar8->m_type - number_integer;
                    if (bVar16 < 2) {
                      local_490._0_8_ = (string *)0x0;
                      nlohmann::detail::
                      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                                (pbVar8,(long *)local_490);
                      mVar2 = (mapped_type_conflict)local_490._0_8_;
                      pkVar9 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::key((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)local_500);
                      std::__cxx11::string::string
                                ((string *)local_490,(pkVar9->_M_dataplus)._M_p,
                                 (allocator *)&local_3e8);
                      pmVar10 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)local_398,(key_type *)local_490);
                      *pmVar10 = mVar2;
                      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_490;
                      _Var17._M_p = (pointer)local_490._0_8_;
LAB_001143a8:
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var17._M_p != &pbVar3->field_2) {
                        operator_delete(_Var17._M_p);
                      }
                    }
                    else if (local_4a0 != (string *)0x0) {
                      std::operator+(&local_3e8,"\'",&local_408);
                      plVar11 = (long *)std::__cxx11::string::append((char *)&local_3e8);
                      local_490._0_8_ = local_490 + 0x10;
                      psVar14 = (string *)(plVar11 + 2);
                      if ((string *)*plVar11 == psVar14) {
                        local_490._16_8_ = (psVar14->_M_dataplus)._M_p;
                        local_490._24_8_ = plVar11[3];
                      }
                      else {
                        local_490._16_8_ = (psVar14->_M_dataplus)._M_p;
                        local_490._0_8_ = (string *)*plVar11;
                      }
                      local_490._8_8_ = plVar11[1];
                      *plVar11 = (long)psVar14;
                      plVar11[1] = 0;
                      *(undefined1 *)(plVar11 + 2) = 0;
                      std::__cxx11::string::_M_append((char *)local_4a0,local_490._0_8_);
                      if ((string *)local_490._0_8_ != (string *)(local_490 + 0x10)) {
                        operator_delete((void *)local_490._0_8_);
                      }
                      pbVar3 = &local_3e8;
                      _Var17._M_p = local_3e8._M_dataplus._M_p;
                      goto LAB_001143a8;
                    }
                    if (1 < bVar16) break;
                    nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_500);
                    bVar6 = nlohmann::detail::
                            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::
                            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                      ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)local_500,
                                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)local_468);
                  }
                }
                else {
                  if (local_4a0 != (string *)0x0) {
                    if (local_430._M_string_length == 0) {
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_468,"\'",&local_408);
                      puVar12 = (undefined8 *)std::__cxx11::string::append(local_468);
                      local_500._0_8_ = local_500 + 0x10;
                      psVar14 = (string *)(puVar12 + 2);
                      if ((string *)*puVar12 == psVar14) {
                        local_500._16_8_ = (psVar14->_M_dataplus)._M_p;
                        local_500._24_8_ = puVar12[3];
                      }
                      else {
                        local_500._16_8_ = (psVar14->_M_dataplus)._M_p;
                        local_500._0_8_ = (string *)*puVar12;
                      }
                      local_500._8_8_ = puVar12[1];
                      *puVar12 = psVar14;
                      puVar12[1] = 0;
                      *(undefined1 *)(puVar12 + 2) = 0;
                      std::__cxx11::string::_M_append((char *)local_4a0,local_500._0_8_);
                      goto LAB_001146e0;
                    }
                    std::operator+(&local_3e8,"\'",&local_408);
                    plVar11 = (long *)std::__cxx11::string::append((char *)&local_3e8);
                    local_490._0_8_ = local_490 + 0x10;
                    psVar14 = (string *)(plVar11 + 2);
                    if ((string *)*plVar11 == psVar14) {
                      local_490._16_8_ = (psVar14->_M_dataplus)._M_p;
                      local_490._24_8_ = plVar11[3];
                    }
                    else {
                      local_490._16_8_ = (psVar14->_M_dataplus)._M_p;
                      local_490._0_8_ = (string *)*plVar11;
                    }
                    local_490._8_8_ = plVar11[1];
                    *plVar11 = (long)psVar14;
                    plVar11[1] = 0;
                    *(undefined1 *)(plVar11 + 2) = 0;
                    plVar11 = (long *)std::__cxx11::string::_M_append
                                                (local_490,(ulong)local_430._M_dataplus._M_p);
                    local_468._0_8_ = local_468 + 0x10;
                    psVar14 = (string *)(plVar11 + 2);
                    if ((string *)*plVar11 == psVar14) {
                      local_468._16_8_ = (psVar14->_M_dataplus)._M_p;
                      local_468._24_8_ = plVar11[3];
                    }
                    else {
                      local_468._16_8_ = (psVar14->_M_dataplus)._M_p;
                      local_468._0_8_ = (string *)*plVar11;
                    }
                    local_468._8_8_ = plVar11[1];
                    *plVar11 = (long)psVar14;
                    plVar11[1] = 0;
                    *(undefined1 *)(plVar11 + 2) = 0;
                    puVar12 = (undefined8 *)std::__cxx11::string::append(local_468);
                    local_500._0_8_ = local_500 + 0x10;
                    psVar14 = (string *)(puVar12 + 2);
                    if ((string *)*puVar12 == psVar14) {
                      local_500._16_8_ = (psVar14->_M_dataplus)._M_p;
                      local_500._24_8_ = puVar12[3];
                    }
                    else {
                      local_500._16_8_ = (psVar14->_M_dataplus)._M_p;
                      local_500._0_8_ = (string *)*puVar12;
                    }
                    local_500._8_8_ = puVar12[1];
                    *puVar12 = psVar14;
                    puVar12[1] = 0;
                    *(undefined1 *)(puVar12 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)local_4a0,local_500._0_8_);
                    if ((string *)local_500._0_8_ != (string *)(local_500 + 0x10)) {
                      operator_delete((void *)local_500._0_8_);
                    }
                    if ((string *)local_468._0_8_ != (string *)(local_468 + 0x10)) {
                      operator_delete((void *)local_468._0_8_);
                    }
                    if ((string *)local_490._0_8_ != (string *)(local_490 + 0x10)) {
                      operator_delete((void *)local_490._0_8_);
                    }
                    pbVar3 = &local_3e8;
                    _Var17._M_p = local_3e8._M_dataplus._M_p;
LAB_00114704:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var17._M_p != &pbVar3->field_2) {
                      operator_delete(_Var17._M_p);
                    }
                  }
LAB_0011470e:
                  bVar6 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_430._M_dataplus._M_p != &local_430.field_2) {
                  operator_delete(local_430._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  operator_delete(local_408._M_dataplus._M_p);
                }
                if (bVar6 != false) {
                  local_468._16_8_ =
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)0x0;
                  local_468._0_8_ = (string *)0x0;
                  local_468._8_8_ = (_Base_ptr)0x0;
                  local_468._24_8_ = -0x8000000000000000;
                  bVar7 = FindMember((json *)local_498,"targets",(json_const_iterator *)local_468);
                  pjVar15 = extraout_RDX;
                  if ((bVar7) &&
                     (pbVar8 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)local_468), pjVar15 = extraout_RDX_00,
                     pbVar8->m_type == array)) {
                    pbVar8 = nlohmann::detail::
                             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)local_468);
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::cend((const_iterator *)local_500,pbVar8);
                    pbVar8 = nlohmann::detail::
                             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)local_468);
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::cbegin((const_iterator *)local_490,pbVar8);
                    bVar7 = nlohmann::detail::
                            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::
                            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                      ((const_iterator *)local_490,
                                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)local_500);
                    pjVar15 = extraout_RDX_01;
                    while (!bVar7) {
                      iStack_4d0._M_node = iStack_4d0._M_node & 0xffffffff00000000;
                      psVar14 = (string *)0x0;
                      local_4c8._M_allocated_capacity = 0;
                      local_4c8._8_8_ = &iStack_4d0;
                      local_4b0 = 0;
                      local_4b8 = (_Base_ptr)local_4c8._8_8_;
                      pbVar8 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)local_490);
                      if (pbVar8->m_type == object) {
                        nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::cbegin((const_iterator *)&local_3e8,pbVar8);
                        nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::cend((const_iterator *)&local_408,pbVar8);
                        while (bVar7 = nlohmann::detail::
                                       iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       ::
                                       operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                                 ((
                                                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  *)&local_3e8,
                                                  (
                                                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  *)&local_408), !bVar7) {
                          pbVar8 = nlohmann::detail::
                                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                *)&local_3e8);
                          if ((byte)(pbVar8->m_type - number_integer) < 2) {
                            local_430._M_dataplus._M_p = (pointer)0x0;
                            nlohmann::detail::
                            get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                                      (pbVar8,(long *)&local_430);
                            mVar2 = (mapped_type_conflict)local_430._M_dataplus._M_p;
                            pkVar9 = nlohmann::detail::
                                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ::key((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)&local_3e8);
                            std::__cxx11::string::string
                                      ((string *)&local_430,(pkVar9->_M_dataplus)._M_p,&local_469);
                            pmVar10 = std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)local_4d8,&local_430);
                            *pmVar10 = mVar2;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_430._M_dataplus._M_p != &local_430.field_2) {
                              operator_delete(local_430._M_dataplus._M_p);
                            }
                          }
                          nlohmann::detail::
                          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&local_3e8);
                        }
                        std::
                        vector<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,std::allocator<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>>
                        ::
                        emplace_back<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                                  ((vector<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,std::allocator<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>>
                                    *)&local_358,
                                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                    *)local_4d8);
                      }
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)local_4d8);
                      nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)local_490);
                      bVar7 = nlohmann::detail::
                              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ::
                              operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                        ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)local_490,
                                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)local_500);
                      pjVar15 = extraout_RDX_02;
                    }
                  }
                  ParseExtensionsProperty(&local_340,local_498,pjVar15);
                  ParseExtrasProperty(&local_310,(json *)local_498);
                  if (cVar1 != '\0') {
                    local_4c8._M_allocated_capacity = 0;
                    local_4d8 = (undefined1  [8])0x0;
                    iStack_4d0._M_node = (_Base_ptr)0x0;
                    local_4c8._8_8_ = 0x8000000000000000;
                    bVar7 = FindMember((json *)local_498,"extensions",
                                       (json_const_iterator *)local_4d8);
                    if (bVar7) {
                      pbVar8 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)local_4d8);
                      psVar14 = (string *)0x20;
                      uVar18 = 0;
                      parent_node = (string *)0x0;
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::dump((string_t *)local_500,pbVar8,-1,' ',false,strict);
                      std::__cxx11::string::operator=((string *)&local_258,(string *)local_500);
                      if ((string *)local_500._0_8_ != (string *)(local_500 + 0x10)) {
                        operator_delete((void *)local_500._0_8_);
                      }
                    }
                    local_4c8._M_allocated_capacity = 0;
                    local_4d8 = (undefined1  [8])0x0;
                    iStack_4d0._M_node = (_Base_ptr)0x0;
                    local_4c8._8_8_ = (iterator *)0x8000000000000000;
                    bVar7 = FindMember((json *)local_498,"extras",(json_const_iterator *)local_4d8);
                    if (bVar7) {
                      pbVar8 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)local_4d8);
                      psVar14 = (string *)0x20;
                      uVar18 = 0;
                      parent_node = (string *)0x0;
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::dump((string_t *)local_500,pbVar8,-1,' ',false,strict);
                      std::__cxx11::string::operator=((string *)&local_278,(string *)local_500);
                      if ((string *)local_500._0_8_ != (string *)(local_500 + 0x10)) {
                        operator_delete((void *)local_500._0_8_);
                      }
                    }
                  }
                  if (bVar6 != false) {
                    std::vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>::
                    emplace_back<tinygltf::Primitive>
                              ((vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_> *)
                               (local_230 + 0x20),(Primitive *)local_398);
                  }
                }
                Primitive::~Primitive((Primitive *)local_398);
                nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator++(&local_90);
                bVar6 = nlohmann::detail::
                        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::
                        operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                  (&local_90,&local_70);
              }
            }
          }
          local_398 = (undefined1  [8])&local_388;
          local_388._M_allocated_capacity = 0x73746867696577;
          iStack_390._M_node = (_Base_ptr)0x7;
          iStack_4d0._M_node = (_Base_ptr)0x0;
          local_4c8._M_allocated_capacity = local_4c8._M_allocated_capacity & 0xffffffffffffff00;
          local_4d8 = (undefined1  [8])&local_4c8;
          ParseNumberArrayProperty
                    ((vector<double,_std::allocator<double>_> *)(local_230 + 0x38),
                     (string *)local_448._M_allocated_capacity,(json *)local_398,psVar14,
                     (bool)required,parent_node);
          pjVar15 = extraout_RDX_03;
          if (local_4d8 != (undefined1  [8])&local_4c8) {
            operator_delete((void *)local_4d8);
            pjVar15 = extraout_RDX_04;
          }
          if (local_398 != (undefined1  [8])&local_388) {
            operator_delete((void *)local_398);
            pjVar15 = extraout_RDX_05;
          }
          ParseExtensionsProperty
                    ((ExtensionMap *)(local_230 + 0x50),(string *)local_448._M_allocated_capacity,
                     pjVar15);
          ParseExtrasProperty(local_3c8,(json *)local_448._M_allocated_capacity);
          if (cVar1 != '\0') {
            local_388._M_allocated_capacity = 0;
            local_398 = (undefined1  [8])0x0;
            iStack_390._M_node = (_Base_ptr)0x0;
            local_388._8_8_ = 0x8000000000000000;
            bVar6 = FindMember((json *)local_448._M_allocated_capacity,"extensions",
                               (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_398);
            if (bVar6) {
              pbVar8 = nlohmann::detail::
                       iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)local_398);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::dump((string_t *)local_4d8,pbVar8,-1,' ',false,strict);
              std::__cxx11::string::operator=((string *)&local_f8,(string *)local_4d8);
              if (local_4d8 != (undefined1  [8])&local_4c8) {
                operator_delete((void *)local_4d8);
              }
            }
            local_388._M_allocated_capacity = 0;
            local_398 = (undefined1  [8])0x0;
            iStack_390._M_node = (_Base_ptr)0x0;
            local_388._8_8_ = (iterator *)0x8000000000000000;
            bVar6 = FindMember((json *)local_448._M_allocated_capacity,"extras",
                               (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_398);
            if (bVar6) {
              pbVar8 = nlohmann::detail::
                       iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)local_398);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::dump((string_t *)local_4d8,pbVar8,-1,' ',false,strict);
              std::__cxx11::string::operator=((string *)&local_118,(string *)local_4d8);
              if (local_4d8 != (undefined1  [8])&local_4c8) {
                operator_delete((void *)local_4d8);
              }
            }
          }
          std::vector<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>::emplace_back<tinygltf::Mesh>
                    ((vector<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_> *)
                     (**(long **)(local_410 + 8) + 0x78),(Mesh *)local_230);
          Mesh::~Mesh((Mesh *)local_230);
          vVar13 = local_4d9;
        }
        else if ((char *)**(undefined8 **)local_410 != (char *)0x0) {
          std::__cxx11::string::append((char *)**(undefined8 **)local_410);
        }
        if (vVar13 != object) {
          return false;
        }
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&local_b0);
        bVar6 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_b0,&local_50);
      } while (!bVar6);
    }
  }
  return true;
}

Assistant:

bool ForEachInArray(const detail::json &_v, const char *member, Callback &&cb) {
  detail::json_const_iterator itm;
  if (detail::FindMember(_v, member, itm) &&
      detail::IsArray(detail::GetValue(itm))) {
    const detail::json &root = detail::GetValue(itm);
    auto it = detail::ArrayBegin(root);
    auto end = detail::ArrayEnd(root);
    for (; it != end; ++it) {
      if (!cb(*it)) return false;
    }
  }
  return true;
}